

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p0709a.cpp
# Opt level: O0

error safe_divide(int i,int j)

{
  arithmetic_errc local_30 [5];
  int local_1c;
  int j_local;
  int i_local;
  
  local_30[4] = j;
  local_1c = i;
  if (j == 0) {
    local_30[3] = 1;
    system_error2::errored_status_code<system_error2::detail::erased<long,_true>_>::
    errored_status_code<arithmetic_errc,_system_error2::status_code<_arithmetic_errc_domain>,_true>
              ((errored_status_code<system_error2::detail::erased<long,_true>_> *)&j_local,
               local_30 + 3);
  }
  else if ((i == -0x80000000) && (j == -1)) {
    local_30[2] = 2;
    system_error2::errored_status_code<system_error2::detail::erased<long,_true>_>::
    errored_status_code<arithmetic_errc,_system_error2::status_code<_arithmetic_errc_domain>,_true>
              ((errored_status_code<system_error2::detail::erased<long,_true>_> *)&j_local,
               local_30 + 2);
  }
  else if (i % j == 0) {
    local_30[0] = success;
    system_error2::errored_status_code<system_error2::detail::erased<long,_true>_>::
    errored_status_code<arithmetic_errc,_system_error2::status_code<_arithmetic_errc_domain>,_true>
              ((errored_status_code<system_error2::detail::erased<long,_true>_> *)&j_local,local_30)
    ;
  }
  else {
    local_30[1] = 3;
    system_error2::errored_status_code<system_error2::detail::erased<long,_true>_>::
    errored_status_code<arithmetic_errc,_system_error2::status_code<_arithmetic_errc_domain>,_true>
              ((errored_status_code<system_error2::detail::erased<long,_true>_> *)&j_local,
               local_30 + 1);
  }
  return (status_code<system_error2::detail::erased<long,_true>_>)
         (status_code<system_error2::detail::erased<long,_true>_>)_j_local;
}

Assistant:

error safe_divide(int i, int j)
{
  if(j == 0)
    return arithmetic_errc::divide_by_zero;
  if(i == INT_MIN && j == -1)
    return arithmetic_errc::integer_divide_overflows;
  if(i % j != 0)
    return arithmetic_errc::not_integer_division;
  return arithmetic_errc::success;
}